

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageOneofFieldGenerator::~MessageOneofFieldGenerator
          (MessageOneofFieldGenerator *this)

{
  MessageOneofFieldGenerator *this_local;
  
  ~MessageOneofFieldGenerator(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

void MessageOneofFieldGenerator::
GenerateDependentAccessorDeclarations(io::Printer* printer) const {
  // Oneof field getters must be dependent as they call default_instance().
  // Otherwise, the logic is the same as MessageFields.
  if (!dependent_field_) {
    return;
  }
  printer->Print(variables_,
      "$deprecated_attr$const $type$& $name$() const;\n");
  MessageFieldGenerator::GenerateDependentAccessorDeclarations(printer);
}